

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O1

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,char *s)

{
  allocator<char> local_71;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00169418;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,s,&local_71);
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_48 + (long)local_50);
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00169780;
  local_30.vtable_ =
       (VTable *)
       internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::
       GetVTable<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable;
  local_30.buffer_.ptr = operator_new(0x28);
  ((local_30.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_30.buffer_.i + 8) = (undefined8 *)(local_30.buffer_.i + 0x18);
  if (local_70 == &local_60) {
    *(undefined8 *)(local_30.buffer_.i + 0x18) = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)(local_30.buffer_.i + 0x20) = uStack_58;
  }
  else {
    *(undefined1 **)(local_30.buffer_.i + 8) = local_70;
    *(ulong *)(local_30.buffer_.i + 0x18) = CONCAT71(uStack_5f,local_60);
  }
  *(undefined8 *)(local_30.buffer_.i + 0x10) = local_68;
  local_68 = 0;
  local_60 = 0;
  local_30.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00169418;
  local_70 = &local_60;
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &local_30);
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::~MatcherBase
            (&local_30);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}